

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O2

deUint8 __thiscall
deqp::gles31::Functional::anon_unknown_1::LineRenderCase::checkLineContinuity
          (LineRenderCase *this,ConstPixelBufferAccess *access,IVec2 *begin,IVec2 *end,
          int componentNdx,int *messageLimitCounter)

{
  ostringstream *this_00;
  char *pcVar1;
  deUint8 dVar2;
  long lVar3;
  long lVar4;
  int x;
  int iVar5;
  byte bVar6;
  bool bVar7;
  IVec2 cursor;
  IVec2 cursorNeighborNeg;
  IVec2 cursorNeighborPos;
  IVec2 advanceNeighbor;
  int local_220;
  Vector<int,_2> local_218;
  Vector<int,_2> local_210;
  int local_208;
  int local_204;
  int local_200;
  int local_1fc;
  IVec2 *local_1f8;
  LineRenderCase *local_1f0;
  int *local_1e8;
  IVec2 *local_1e0;
  long local_1d8;
  ConstPixelBufferAccess *local_1d0;
  undefined1 local_1c8 [24];
  undefined1 local_1b0 [384];
  
  bVar7 = begin->m_data[0] == end->m_data[0];
  local_210.m_data[0] = (int)!bVar7;
  local_210.m_data[1] = (int)bVar7;
  local_1f8 = begin;
  local_1f0 = this;
  local_1e8 = messageLimitCounter;
  tcu::Vector<int,_2>::Vector(&local_218,begin);
  local_1d8 = (long)componentNdx;
  local_220 = 0;
  iVar5 = 0;
  bVar6 = 0;
  lVar3 = local_1d8;
  local_1e0 = end;
  local_1d0 = access;
  while ((local_218.m_data[0] != end->m_data[0] || (local_218.m_data[1] != end->m_data[1]))) {
    x = (int)access;
    tcu::ConstPixelBufferAccess::getPixelInt
              ((ConstPixelBufferAccess *)local_1b0,x,local_218.m_data[0],local_218.m_data[1]);
    if ((bool)(~bVar6 & 1 | *(int *)(local_1b0 + lVar3 * 4) != 0)) {
      bVar6 = bVar6 | *(int *)(local_1b0 + lVar3 * 4) != 0;
      lVar4 = lVar3;
    }
    else {
      local_1b0._0_8_ = &DAT_100000001;
      tcu::operator-((Vector<int,_2> *)local_1b0,&local_210);
      tcu::operator+(&local_218,(Vector<int,_2> *)(local_1c8 + 0x10));
      tcu::operator-(&local_218,(Vector<int,_2> *)(local_1c8 + 0x10));
      tcu::ConstPixelBufferAccess::getPixelInt
                ((ConstPixelBufferAccess *)local_1b0,x,local_200,local_1fc);
      lVar4 = local_1d8;
      access = local_1d0;
      end = local_1e0;
      if (*(int *)(local_1b0 + lVar3 * 4) == 0) {
        tcu::ConstPixelBufferAccess::getPixelInt
                  ((ConstPixelBufferAccess *)local_1c8,x,local_208,local_204);
        local_220 = local_220 + (uint)(*(int *)(local_1c8 + lVar3 * 4) == 0);
        lVar4 = local_1d8;
        access = local_1d0;
        end = local_1e0;
      }
    }
    iVar5 = iVar5 + 1;
    tcu::Vector<int,_2>::operator+=(&local_218,&local_210);
    lVar3 = lVar4;
  }
  if ((local_220 < 1) || (*local_1e8 = *local_1e8 + -1, *local_1e8 < 0)) {
    dVar2 = '\0';
  }
  else {
    local_1b0._0_8_ =
         ((local_1f0->super_BBoxRenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
         ->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"Found non-continuous ");
    pcVar1 = "uni_atom_vertical";
    if (local_210.m_data[0] == 1) {
      pcVar1 = "uni_atom_horizontal";
    }
    std::operator<<((ostream *)this_00,pcVar1 + 9);
    std::operator<<((ostream *)this_00," line near ");
    tcu::operator<<((ostream *)this_00,local_1f8);
    std::operator<<((ostream *)this_00,". ");
    std::operator<<((ostream *)this_00,"Missed pixels: ");
    std::ostream::operator<<(this_00,local_220);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    dVar2 = (local_220 <=
            (int)((float)iVar5 * 0.1 +
                 *(float *)(&DAT_017cff80 + (ulong)((float)iVar5 * 0.1 < 0.0) * 4))) * ' ' + ' ';
  }
  return dVar2;
}

Assistant:

deUint8 LineRenderCase::checkLineContinuity (const tcu::ConstPixelBufferAccess& access, const tcu::IVec2& begin, const tcu::IVec2& end, int componentNdx, int& messageLimitCounter) const
{
	bool				line					= false;
	const tcu::IVec2	advance					= (begin.x() == end.x()) ? (tcu::IVec2(0, 1)) : (tcu::IVec2(1, 0));
	int					missedPixels			= 0;
	int					totalPixels				= 0;
	deUint8				errorMask				= 0;

	for (tcu::IVec2 cursor = begin; cursor != end; cursor += advance)
	{
		const bool hit = (access.getPixelInt(cursor.x(), cursor.y())[componentNdx] != 0);

		if (hit)
			line = true;
		else if (line && !hit)
		{
			// non-continuous line detected
			const tcu::IVec2 advanceNeighbor	= tcu::IVec2(1, 1) - advance;
			const tcu::IVec2 cursorNeighborPos	= cursor + advanceNeighbor;
			const tcu::IVec2 cursorNeighborNeg	= cursor - advanceNeighbor;
			// hw precision issues may lead to a line being non-straight -> check neighboring pixels
			if ((access.getPixelInt(cursorNeighborPos.x(), cursorNeighborPos.y())[componentNdx] == 0) && (access.getPixelInt(cursorNeighborNeg.x(), cursorNeighborNeg.y())[componentNdx] == 0))
				++missedPixels;
		}
		++totalPixels;
	}

	if (missedPixels > 0 && --messageLimitCounter >= 0)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Found non-continuous " << ((advance.x() == 1)  ? ("horizontal") : ("vertical")) << " line near " << begin << ". "
			<< "Missed pixels: " << missedPixels
			<< tcu::TestLog::EndMessage;
		// allow 10% missing pixels for warning
		if (missedPixels <= deRoundFloatToInt32((float)totalPixels * 0.1f))
			errorMask = SCANRESULT_LINE_CONT_WARN_BIT;
		else
			errorMask =  SCANRESULT_LINE_CONT_ERR_BIT;
	}

	return errorMask;
}